

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

SAM_hdr_type * sam_hdr_find(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  khint_t kVar1;
  kh_m_s2i_t *pkVar2;
  kh_sam_hdr_t *pkVar3;
  khint32_t *pkVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  SAM_hdr_type *pSVar9;
  SAM_hdr_type **ppSVar10;
  byte bVar11;
  char *pcVar12;
  SAM_hdr_type *pSVar13;
  SAM_hdr_type *pSVar14;
  SAM_hdr_tag *pSVar15;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  SAM_hdr_type *pSVar20;
  uint uVar21;
  bool bVar22;
  
  cVar6 = *type;
  bVar11 = type[1];
  if (ID_key == (char *)0x0) {
LAB_00133aa3:
    pkVar3 = hdr->h;
    kVar1 = pkVar3->n_buckets;
    if (kVar1 == 0) {
      uVar7 = 0;
    }
    else {
      uVar21 = (int)cVar6 << 8 | (int)(char)bVar11;
      uVar16 = kVar1 - 1 & uVar21;
      iVar19 = 1;
      uVar18 = uVar16;
      do {
        bVar11 = (char)uVar18 * '\x02' & 0x1e;
        uVar7 = pkVar3->flags[uVar18 >> 4] >> bVar11;
        if (((uVar7 & 2) != 0) || (((uVar7 & 1) == 0 && (pkVar3->keys[uVar18] == uVar21)))) {
          uVar7 = uVar18;
          if ((pkVar3->flags[uVar18 >> 4] >> bVar11 & 3) != 0) {
            uVar7 = kVar1;
          }
          break;
        }
        uVar18 = uVar18 + iVar19 & kVar1 - 1;
        iVar19 = iVar19 + 1;
        uVar7 = kVar1;
      } while (uVar18 != uVar16);
    }
    if (uVar7 != kVar1) {
      pSVar13 = (SAM_hdr_type *)(ulong)uVar7;
      pSVar9 = pkVar3->vals[(long)pSVar13];
      pSVar14 = pSVar9;
      if (ID_key == (char *)0x0) {
        return pSVar9;
      }
      do {
        pSVar15 = pSVar14->tag;
        bVar22 = pSVar15 == (SAM_hdr_tag *)0x0;
        if (!bVar22) {
          do {
            pcVar12 = pSVar15->str;
            if ((*pcVar12 == *ID_key) && (pcVar12[1] == ID_key[1])) {
              cVar6 = pcVar12[3];
              pcVar17 = ID_value;
              if (cVar6 != '\0') {
                pcVar12 = pcVar12 + 4;
                do {
                  if (cVar6 != *pcVar17) {
                    bVar5 = true;
                    pSVar20 = pSVar13;
                    goto LAB_00133b90;
                  }
                  pcVar17 = pcVar17 + 1;
                  cVar6 = *pcVar12;
                  pcVar12 = pcVar12 + 1;
                } while (cVar6 != '\0');
              }
              bVar5 = false;
              pSVar20 = pSVar14;
LAB_00133b90:
              if (*pcVar17 == '\0') {
                pSVar13 = pSVar20;
              }
              if (!bVar5 && *pcVar17 == '\0') goto LAB_00133bae;
            }
            pSVar15 = pSVar15->next;
            bVar22 = pSVar15 == (SAM_hdr_tag_s *)0x0;
          } while (!bVar22);
        }
        pSVar14 = pSVar14->next;
LAB_00133bae:
        if (!bVar22) {
          return pSVar13;
        }
      } while (pSVar14 != pSVar9);
    }
LAB_00133df4:
    pSVar9 = (SAM_hdr_type *)0x0;
  }
  else {
    if (((bVar11 == 0x51 && cVar6 == 'S') && (*ID_key == 'S')) && (ID_key[1] == 'N')) {
      pkVar2 = hdr->ref_hash;
      kVar1 = pkVar2->n_buckets;
      if (kVar1 == 0) {
        uVar7 = 0;
      }
      else {
        uVar18 = (uint)*ID_value;
        if (*ID_value == '\0') {
          uVar18 = 0;
        }
        else {
          cVar6 = ID_value[1];
          if (cVar6 != '\0') {
            pcVar12 = ID_value + 2;
            do {
              uVar18 = (int)cVar6 + uVar18 * 0x1f;
              cVar6 = *pcVar12;
              pcVar12 = pcVar12 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar18 = uVar18 & kVar1 - 1;
        pkVar4 = pkVar2->flags;
        iVar19 = 1;
        uVar21 = uVar18;
        do {
          uVar16 = pkVar4[uVar21 >> 4];
          bVar11 = (char)uVar21 * '\x02' & 0x1e;
          uVar7 = uVar16 >> bVar11;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar2->keys[uVar21],ID_value), iVar8 == 0)))) {
            uVar7 = uVar21;
            if ((uVar16 >> bVar11 & 3) != 0) {
              uVar7 = kVar1;
            }
            break;
          }
          uVar21 = uVar21 + iVar19 & kVar1 - 1;
          iVar19 = iVar19 + 1;
          uVar7 = kVar1;
        } while (uVar21 != uVar18);
      }
      if (uVar7 == kVar1) goto LAB_00133df4;
      ppSVar10 = &hdr->ref[pkVar2->vals[uVar7]].ty;
    }
    else if (((cVar6 == 'R' && (bVar11 ^ 0x47) == 0) && (*ID_key == 'I')) && (ID_key[1] == 'D')) {
      pkVar2 = hdr->rg_hash;
      kVar1 = pkVar2->n_buckets;
      if (kVar1 == 0) {
        uVar7 = 0;
      }
      else {
        uVar18 = (uint)*ID_value;
        if (*ID_value == '\0') {
          uVar18 = 0;
        }
        else {
          cVar6 = ID_value[1];
          if (cVar6 != '\0') {
            pcVar12 = ID_value + 2;
            do {
              uVar18 = (int)cVar6 + uVar18 * 0x1f;
              cVar6 = *pcVar12;
              pcVar12 = pcVar12 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar18 = uVar18 & kVar1 - 1;
        pkVar4 = pkVar2->flags;
        iVar19 = 1;
        uVar21 = uVar18;
        do {
          uVar16 = pkVar4[uVar21 >> 4];
          bVar11 = (char)uVar21 * '\x02' & 0x1e;
          uVar7 = uVar16 >> bVar11;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar2->keys[uVar21],ID_value), iVar8 == 0)))) {
            uVar7 = uVar21;
            if ((uVar16 >> bVar11 & 3) != 0) {
              uVar7 = kVar1;
            }
            break;
          }
          uVar21 = uVar21 + iVar19 & kVar1 - 1;
          iVar19 = iVar19 + 1;
          uVar7 = kVar1;
        } while (uVar21 != uVar18);
      }
      if (uVar7 == kVar1) goto LAB_00133df4;
      ppSVar10 = &hdr->rg[pkVar2->vals[uVar7]].ty;
    }
    else {
      if (((cVar6 != 'P' || (bVar11 ^ 0x47) != 0) || (*ID_key != 'I')) || (ID_key[1] != 'D'))
      goto LAB_00133aa3;
      pkVar2 = hdr->pg_hash;
      kVar1 = pkVar2->n_buckets;
      if (kVar1 == 0) {
        uVar7 = 0;
      }
      else {
        uVar18 = (uint)*ID_value;
        if (*ID_value == '\0') {
          uVar18 = 0;
        }
        else {
          cVar6 = ID_value[1];
          if (cVar6 != '\0') {
            pcVar12 = ID_value + 2;
            do {
              uVar18 = (int)cVar6 + uVar18 * 0x1f;
              cVar6 = *pcVar12;
              pcVar12 = pcVar12 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar18 = uVar18 & kVar1 - 1;
        pkVar4 = pkVar2->flags;
        iVar19 = 1;
        uVar21 = uVar18;
        do {
          uVar16 = pkVar4[uVar21 >> 4];
          bVar11 = (char)uVar21 * '\x02' & 0x1e;
          uVar7 = uVar16 >> bVar11;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar2->keys[uVar21],ID_value), iVar8 == 0)))) {
            uVar7 = uVar21;
            if ((uVar16 >> bVar11 & 3) != 0) {
              uVar7 = kVar1;
            }
            break;
          }
          uVar21 = uVar21 + iVar19 & kVar1 - 1;
          iVar19 = iVar19 + 1;
          uVar7 = kVar1;
        } while (uVar21 != uVar18);
      }
      if (uVar7 == kVar1) goto LAB_00133df4;
      ppSVar10 = &hdr->pg[pkVar2->vals[uVar7]].ty;
    }
    pSVar9 = *ppSVar10;
  }
  return pSVar9;
}

Assistant:

SAM_hdr_type *sam_hdr_find(SAM_hdr *hdr, char *type,
			   char *ID_key, char *ID_value) {
    SAM_hdr_type *t1, *t2;
    int itype = (type[0]<<8)|(type[1]);
    khint_t k;

    /* Special case for types we have prebuilt hashes on */
    if (ID_key) {
	if (type[0]   == 'S' && type[1]   == 'Q' &&
	    ID_key[0] == 'S' && ID_key[1] == 'N') {
	    k = kh_get(m_s2i, hdr->ref_hash, ID_value);
	    return k != kh_end(hdr->ref_hash)
		? hdr->ref[kh_val(hdr->ref_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'R' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->rg_hash, ID_value);
	    return k != kh_end(hdr->rg_hash)
		? hdr->rg[kh_val(hdr->rg_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'P' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->pg_hash, ID_value);
	    return k != kh_end(hdr->pg_hash)
		? hdr->pg[kh_val(hdr->pg_hash, k)].ty
		: NULL;
	}
    }

    k = kh_get(sam_hdr, hdr->h, itype);
    if (k == kh_end(hdr->h))
	return NULL;
    
    if (!ID_key)
	return kh_val(hdr->h, k);

    t1 = t2 = kh_val(hdr->h, k);
    do {
	SAM_hdr_tag *tag;
	for (tag = t1->tag; tag; tag = tag->next) {
	    if (tag->str[0] == ID_key[0] && tag->str[1] == ID_key[1]) {
		char *cp1 = tag->str+3;
		char *cp2 = ID_value;
		while (*cp1 && *cp1 == *cp2)
		    cp1++, cp2++;
		if (*cp2 || *cp1)
		    continue;
		return t1;
	    }
	}
	t1 = t1->next;
    } while (t1 != t2);

    return NULL;
}